

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::getDistinctSamplerTypes
               (vector<glu::DataType,_std::allocator<glu::DataType>_> *dst,VarType *type)

{
  StructType *pSVar1;
  pointer pSVar2;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  _Var3;
  int i;
  long lVar4;
  long lVar5;
  DataType local_2c;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type == TYPE_BASIC) {
    local_2c = (type->m_data).basic.type;
    if (local_2c - TYPE_SAMPLER_1D < 0x1e) {
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>,__gnu_cxx::__ops::_Iter_equals_val<glu::DataType_const>>
                        ((dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         (dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
                         _M_impl.super__Vector_impl_data._M_finish,&local_2c);
      if (_Var3._M_current ==
          (dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back(dst,&local_2c);
      }
    }
  }
  else {
    pSVar1 = (type->m_data).structPtr;
    lVar5 = 0x20;
    for (lVar4 = 0;
        pSVar2 = (pSVar1->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar4 < (int)(((long)(pSVar1->m_members).
                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x38);
        lVar4 = lVar4 + 1) {
      getDistinctSamplerTypes(dst,(VarType *)((long)&(pSVar2->m_name)._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + 0x38;
    }
  }
  return;
}

Assistant:

static void getDistinctSamplerTypes (vector<glu::DataType>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
	{
		const glu::DataType basicType = type.getBasicType();
		if (glu::isDataTypeSampler(basicType) && std::find(dst.begin(), dst.end(), basicType) == dst.end())
			dst.push_back(basicType);
	}
	else if (type.isArrayType())
		getDistinctSamplerTypes(dst, type.getElementType());
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			getDistinctSamplerTypes(dst, structType.getMember(i).getType());
	}
}